

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint8_avx2.h
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::ObjectIntersectorK<8,_false>_>,_false>
     ::occludedCoherent(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  AccelData *pAVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  uint uVar14;
  undefined4 uVar15;
  ulong uVar16;
  RTCIntersectFunctionN p_Var17;
  ulong uVar18;
  ulong uVar19;
  ulong *puVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  Geometry *pGVar24;
  ulong uVar25;
  ulong uVar26;
  ulong *puVar27;
  bool bVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [64];
  vint4 ai_1;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  vint4 ai;
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined4 in_register_000015dc;
  undefined1 auVar60 [32];
  undefined1 auVar61 [64];
  vint8 bi_1;
  vint<8> octant;
  vint<8> mask;
  StackItemMaskT<embree::NodeRefPtr<4>_> stack [244];
  RTCIntersectFunctionNArguments local_1388;
  Geometry *local_1358;
  undefined8 local_1350;
  RTCIntersectArguments *local_1348;
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  uint local_12d0;
  uint uStack_12cc;
  uint uStack_12c8;
  uint uStack_12c4;
  undefined4 local_12c0;
  undefined4 uStack_12bc;
  undefined4 uStack_12b8;
  undefined4 uStack_12b4;
  undefined4 local_12b0;
  undefined4 uStack_12ac;
  undefined4 uStack_12a8;
  undefined4 uStack_12a4;
  uint local_12a0;
  uint uStack_129c;
  uint uStack_1298;
  uint uStack_1294;
  undefined1 local_1290 [16];
  undefined1 local_1280 [16];
  undefined1 local_1270 [16];
  uint local_1260;
  uint uStack_125c;
  uint uStack_1258;
  uint uStack_1254;
  float local_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  uint local_1240;
  uint uStack_123c;
  uint uStack_1238;
  uint uStack_1234;
  undefined1 local_1230 [16];
  uint local_1220;
  uint uStack_121c;
  uint uStack_1218;
  uint uStack_1214;
  undefined1 local_1210 [16];
  uint local_1200;
  uint uStack_11fc;
  uint uStack_11f8;
  uint uStack_11f4;
  float local_11f0;
  float fStack_11ec;
  float fStack_11e8;
  float fStack_11e4;
  float local_11e0;
  float fStack_11dc;
  float fStack_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  float fStack_11c8;
  uint uStack_11c4;
  float local_11c0;
  float fStack_11bc;
  float fStack_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  undefined4 uStack_11a4;
  undefined1 local_11a0 [32];
  anon_union_32_3_898e2e57_for_vint_impl<8>_1 local_1180;
  undefined4 local_1160;
  undefined4 uStack_115c;
  undefined4 uStack_1158;
  undefined4 uStack_1154;
  undefined4 uStack_1150;
  undefined4 uStack_114c;
  undefined4 uStack_1148;
  undefined4 uStack_1144;
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  float local_1100;
  float fStack_10fc;
  float fStack_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float fStack_10e8;
  uint uStack_10e4;
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  uint uStack_10c4;
  float local_10c0;
  float fStack_10bc;
  float fStack_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float fStack_10a8;
  undefined4 uStack_10a4;
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  float local_fe0;
  float fStack_fdc;
  float fStack_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float fStack_fc8;
  uint uStack_fc4;
  undefined1 local_fc0 [32];
  ulong local_fa0 [494];
  undefined1 auVar55 [64];
  
  auVar52 = vpcmpeqd_avx2(in_ZMM9._0_32_,in_ZMM9._0_32_);
  auVar29 = vpcmpeqd_avx2(auVar52,(undefined1  [32])valid_i->field_0);
  uVar14 = vmovmskps_avx(auVar29);
  if (uVar14 != 0) {
    local_1180.v = valid_i->field_0;
    pAVar1 = This->ptr;
    uVar19 = (ulong)(uVar14 & 0xff);
    auVar43 = *(undefined1 (*) [32])(ray + 0x80);
    auVar40._8_4_ = 0x7fffffff;
    auVar40._0_8_ = 0x7fffffff7fffffff;
    auVar40._12_4_ = 0x7fffffff;
    auVar40._16_4_ = 0x7fffffff;
    auVar40._20_4_ = 0x7fffffff;
    auVar40._24_4_ = 0x7fffffff;
    auVar40._28_4_ = 0x7fffffff;
    auVar45._8_4_ = 0x219392ef;
    auVar45._0_8_ = 0x219392ef219392ef;
    auVar45._12_4_ = 0x219392ef;
    auVar45._16_4_ = 0x219392ef;
    auVar45._20_4_ = 0x219392ef;
    auVar45._24_4_ = 0x219392ef;
    auVar45._28_4_ = 0x219392ef;
    auVar33 = vandps_avx(auVar43,auVar40);
    auVar33 = vcmpps_avx(auVar33,auVar45,1);
    auVar34 = vblendvps_avx(auVar43,auVar45,auVar33);
    auVar33 = vandps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar40);
    auVar33 = vcmpps_avx(auVar33,auVar45,1);
    auVar46 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar45,auVar33);
    auVar33 = vandps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar40);
    auVar33 = vcmpps_avx(auVar33,auVar45,1);
    auVar40 = vrcpps_avx(auVar34);
    auVar33 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar45,auVar33);
    auVar41._8_4_ = 0x3f800000;
    auVar41._0_8_ = &DAT_3f8000003f800000;
    auVar41._12_4_ = 0x3f800000;
    auVar41._16_4_ = 0x3f800000;
    auVar41._20_4_ = 0x3f800000;
    auVar41._24_4_ = 0x3f800000;
    auVar41._28_4_ = 0x3f800000;
    auVar45 = vrcpps_avx(auVar46);
    auVar6 = vfnmadd213ps_fma(auVar34,auVar40,auVar41);
    auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar40,auVar40);
    auVar56 = ZEXT1664(auVar6);
    auVar7 = vfnmadd213ps_fma(auVar46,auVar45,auVar41);
    auVar7 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar45,auVar45);
    auVar57 = ZEXT1664(auVar7);
    auVar34 = vrcpps_avx(auVar33);
    auVar44 = vfnmadd213ps_fma(auVar33,auVar34,auVar41);
    auVar44 = vfmadd132ps_fma(ZEXT1632(auVar44),auVar34,auVar34);
    auVar58 = ZEXT1664(auVar44);
    auVar54 = ZEXT816(0) << 0x40;
    auVar55 = ZEXT1664(auVar54);
    local_1120 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),ZEXT1632(auVar54));
    local_1140 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar54));
    auVar53 = ZEXT3264(auVar52 ^ auVar29);
    auVar40 = ZEXT1632(auVar54);
    auVar43 = vcmpps_avx(auVar43,auVar40,1);
    auVar33._8_4_ = 1;
    auVar33._0_8_ = 0x100000001;
    auVar33._12_4_ = 1;
    auVar33._16_4_ = 1;
    auVar33._20_4_ = 1;
    auVar33._24_4_ = 1;
    auVar33._28_4_ = 1;
    auVar43 = vandps_avx(auVar43,auVar33);
    auVar33 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar40,1);
    auVar46._8_4_ = 2;
    auVar46._0_8_ = 0x200000002;
    auVar46._12_4_ = 2;
    auVar46._16_4_ = 2;
    auVar46._20_4_ = 2;
    auVar46._24_4_ = 2;
    auVar46._28_4_ = 2;
    auVar33 = vandps_avx(auVar33,auVar46);
    auVar33 = vorps_avx(auVar33,auVar43);
    auVar34._8_4_ = 4;
    auVar34._0_8_ = 0x400000004;
    auVar34._12_4_ = 4;
    auVar34._16_4_ = 4;
    auVar34._20_4_ = 4;
    auVar34._24_4_ = 4;
    auVar34._28_4_ = 4;
    auVar43 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar40,1);
    auVar43 = vandps_avx(auVar43,auVar34);
    auVar52 = vpor_avx2(auVar52 ^ auVar29,auVar43);
    local_11a0 = vpor_avx2(auVar52,auVar33);
    local_10c0 = *(float *)ray;
    fStack_10bc = *(float *)(ray + 4);
    fStack_10b8 = *(float *)(ray + 8);
    fStack_10b4 = *(float *)(ray + 0xc);
    fStack_10b0 = *(float *)(ray + 0x10);
    fStack_10ac = *(float *)(ray + 0x14);
    fStack_10a8 = *(float *)(ray + 0x18);
    uStack_10a4 = *(undefined4 *)(ray + 0x1c);
    local_11c0 = auVar6._0_4_ * -*(float *)ray;
    fStack_11bc = auVar6._4_4_ * -*(float *)(ray + 4);
    fStack_11b8 = auVar6._8_4_ * -*(float *)(ray + 8);
    fStack_11b4 = auVar6._12_4_ * -*(float *)(ray + 0xc);
    fStack_11b0 = -*(float *)(ray + 0x10) * 0.0;
    fStack_11ac = -*(float *)(ray + 0x14) * 0.0;
    fStack_11a8 = -*(float *)(ray + 0x18) * 0.0;
    local_10e0 = *(float *)(ray + 0x20);
    fStack_10dc = *(float *)(ray + 0x24);
    fStack_10d8 = *(float *)(ray + 0x28);
    fStack_10d4 = *(float *)(ray + 0x2c);
    fStack_10d0 = *(float *)(ray + 0x30);
    fStack_10cc = *(float *)(ray + 0x34);
    fStack_10c8 = *(float *)(ray + 0x38);
    uStack_10c4 = *(uint *)(ray + 0x3c);
    uStack_11c4 = *(uint *)(ray + 0x3c) ^ 0x80000000;
    local_11e0 = auVar7._0_4_ * -*(float *)(ray + 0x20);
    fStack_11dc = auVar7._4_4_ * -*(float *)(ray + 0x24);
    fStack_11d8 = auVar7._8_4_ * -*(float *)(ray + 0x28);
    fStack_11d4 = auVar7._12_4_ * -*(float *)(ray + 0x2c);
    fStack_11d0 = -*(float *)(ray + 0x30) * 0.0;
    fStack_11cc = -*(float *)(ray + 0x34) * 0.0;
    fStack_11c8 = -*(float *)(ray + 0x38) * 0.0;
    local_1100 = *(float *)(ray + 0x40);
    fStack_10fc = *(float *)(ray + 0x44);
    fStack_10f8 = *(float *)(ray + 0x48);
    fStack_10f4 = *(float *)(ray + 0x4c);
    fStack_10f0 = *(float *)(ray + 0x50);
    fStack_10ec = *(float *)(ray + 0x54);
    fStack_10e8 = *(float *)(ray + 0x58);
    uStack_10e4 = *(uint *)(ray + 0x5c);
    local_1000 = mm_lookupmask_ps._16_8_;
    uStack_ff8 = mm_lookupmask_ps._24_8_;
    uStack_ff0 = mm_lookupmask_ps._16_8_;
    uStack_fe8 = mm_lookupmask_ps._24_8_;
    local_fe0 = auVar44._0_4_ * -*(float *)(ray + 0x40);
    fStack_fdc = auVar44._4_4_ * -*(float *)(ray + 0x44);
    fStack_fd8 = auVar44._8_4_ * -*(float *)(ray + 0x48);
    fStack_fd4 = auVar44._12_4_ * -*(float *)(ray + 0x4c);
    fStack_fd0 = -*(float *)(ray + 0x50) * 0.0;
    fStack_fcc = -*(float *)(ray + 0x54) * 0.0;
    fStack_fc8 = -*(float *)(ray + 0x58) * 0.0;
    uStack_fc4 = *(uint *)(ray + 0x5c) ^ 0x80000000;
    local_12d0 = 0x80000000;
    uStack_12cc = 0x80000000;
    uStack_12c8 = 0x80000000;
    uStack_12c4 = 0x80000000;
    local_1160 = 0x7f800000;
    uStack_115c = 0x7f800000;
    uStack_1158 = 0x7f800000;
    uStack_1154 = 0x7f800000;
    uStack_1150 = 0x7f800000;
    uStack_114c = 0x7f800000;
    uStack_1148 = 0x7f800000;
    uStack_1144 = 0x7f800000;
    local_1060 = ZEXT1632(auVar6);
    local_1080 = ZEXT1632(auVar7);
    local_10a0 = ZEXT1632(auVar44);
    uStack_11a4 = in_register_000015dc;
    do {
      lVar5 = 0;
      for (uVar16 = uVar19; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
        lVar5 = lVar5 + 1;
      }
      uVar15 = *(undefined4 *)(local_11a0 + lVar5 * 4);
      auVar29._4_4_ = uVar15;
      auVar29._0_4_ = uVar15;
      auVar29._8_4_ = uVar15;
      auVar29._12_4_ = uVar15;
      auVar29._16_4_ = uVar15;
      auVar29._20_4_ = uVar15;
      auVar29._24_4_ = uVar15;
      auVar29._28_4_ = uVar15;
      local_1340 = vpcmpeqd_avx2(auVar29,local_11a0);
      uVar15 = vmovmskps_avx(local_1340);
      uVar16 = CONCAT44((int)((ulong)lVar5 >> 0x20),uVar15);
      uVar19 = ~uVar16 & uVar19;
      auVar47._8_4_ = 0x7f800000;
      auVar47._0_8_ = 0x7f8000007f800000;
      auVar47._12_4_ = 0x7f800000;
      auVar47._16_4_ = 0x7f800000;
      auVar47._20_4_ = 0x7f800000;
      auVar47._24_4_ = 0x7f800000;
      auVar47._28_4_ = 0x7f800000;
      auVar52 = vblendvps_avx(auVar47,auVar56._0_32_,local_1340);
      auVar29 = vshufps_avx(auVar52,auVar52,0xb1);
      auVar52 = vminps_avx(auVar52,auVar29);
      auVar29 = vshufpd_avx(auVar52,auVar52,5);
      auVar52 = vminps_avx(auVar52,auVar29);
      auVar6 = vminps_avx(auVar52._0_16_,auVar52._16_16_);
      auVar52 = vblendvps_avx(auVar47,auVar57._0_32_,local_1340);
      auVar29 = vshufps_avx(auVar52,auVar52,0xb1);
      auVar52 = vminps_avx(auVar52,auVar29);
      auVar29 = vshufpd_avx(auVar52,auVar52,5);
      auVar52 = vminps_avx(auVar52,auVar29);
      auVar7 = vminps_avx(auVar52._0_16_,auVar52._16_16_);
      auVar7 = vunpcklps_avx(auVar6,auVar7);
      auVar52 = vblendvps_avx(auVar47,auVar58._0_32_,local_1340);
      auVar29 = vshufps_avx(auVar52,auVar52,0xb1);
      auVar52 = vminps_avx(auVar52,auVar29);
      auVar29 = vshufpd_avx(auVar52,auVar52,5);
      auVar52 = vminps_avx(auVar52,auVar29);
      auVar6 = vminps_avx(auVar52._0_16_,auVar52._16_16_);
      auVar60._8_4_ = 0xff800000;
      auVar60._0_8_ = 0xff800000ff800000;
      auVar60._12_4_ = 0xff800000;
      auVar60._16_4_ = 0xff800000;
      auVar60._20_4_ = 0xff800000;
      auVar60._24_4_ = 0xff800000;
      auVar60._28_4_ = 0xff800000;
      auVar52 = vblendvps_avx(auVar60,auVar56._0_32_,local_1340);
      auVar39 = vinsertps_avx(auVar7,auVar6,0x28);
      auVar29 = vshufps_avx(auVar52,auVar52,0xb1);
      auVar52 = vmaxps_avx(auVar52,auVar29);
      auVar29 = vshufpd_avx(auVar52,auVar52,5);
      auVar29 = vmaxps_avx(auVar52,auVar29);
      auVar52 = vblendvps_avx(auVar60,auVar57._0_32_,local_1340);
      auVar6 = vmaxps_avx(auVar29._0_16_,auVar29._16_16_);
      auVar29 = vshufps_avx(auVar52,auVar52,0xb1);
      auVar52 = vmaxps_avx(auVar52,auVar29);
      auVar29 = vshufpd_avx(auVar52,auVar52,5);
      auVar52 = vmaxps_avx(auVar52,auVar29);
      auVar7 = vmaxps_avx(auVar52._0_16_,auVar52._16_16_);
      auVar7 = vunpcklps_avx(auVar6,auVar7);
      auVar52 = vblendvps_avx(auVar60,auVar58._0_32_,local_1340);
      auVar29 = vshufps_avx(auVar52,auVar52,0xb1);
      auVar52 = vmaxps_avx(auVar52,auVar29);
      auVar29 = vshufpd_avx(auVar52,auVar52,5);
      auVar52 = vmaxps_avx(auVar52,auVar29);
      auVar6 = vmaxps_avx(auVar52._0_16_,auVar52._16_16_);
      auVar2 = vinsertps_avx(auVar7,auVar6,0x28);
      auVar54 = vcmpps_avx(auVar39,_DAT_01feba10,5);
      auVar6 = vblendvps_avx(auVar2,auVar39,auVar54);
      auVar7 = vmovshdup_avx(auVar6);
      uVar25 = (ulong)(auVar7._0_4_ < 0.0) << 4 | 0x20;
      auVar7 = vshufpd_avx(auVar6,auVar6,1);
      uVar18 = (ulong)(auVar7._0_4_ < 0.0) << 4 | 0x40;
      local_11f0 = auVar6._0_4_;
      auVar12._4_4_ = fStack_10bc;
      auVar12._0_4_ = local_10c0;
      auVar12._8_4_ = fStack_10b8;
      auVar12._12_4_ = fStack_10b4;
      auVar12._16_4_ = fStack_10b0;
      auVar12._20_4_ = fStack_10ac;
      auVar12._24_4_ = fStack_10a8;
      auVar12._28_4_ = uStack_10a4;
      auVar52 = vblendvps_avx(auVar47,auVar12,local_1340);
      auVar29 = vshufps_avx(auVar52,auVar52,0xb1);
      auVar52 = vminps_avx(auVar52,auVar29);
      auVar29 = vshufpd_avx(auVar52,auVar52,5);
      auVar52 = vminps_avx(auVar52,auVar29);
      auVar7 = vminps_avx(auVar52._0_16_,auVar52._16_16_);
      auVar11._4_4_ = fStack_10dc;
      auVar11._0_4_ = local_10e0;
      auVar11._8_4_ = fStack_10d8;
      auVar11._12_4_ = fStack_10d4;
      auVar11._16_4_ = fStack_10d0;
      auVar11._20_4_ = fStack_10cc;
      auVar11._24_4_ = fStack_10c8;
      auVar11._28_4_ = uStack_10c4;
      auVar52 = vblendvps_avx(auVar47,auVar11,local_1340);
      auVar29 = vshufps_avx(auVar52,auVar52,0xb1);
      auVar52 = vminps_avx(auVar52,auVar29);
      auVar29 = vshufpd_avx(auVar52,auVar52,5);
      auVar52 = vminps_avx(auVar52,auVar29);
      auVar44 = vminps_avx(auVar52._0_16_,auVar52._16_16_);
      auVar44 = vunpcklps_avx(auVar7,auVar44);
      auVar43._4_4_ = fStack_10fc;
      auVar43._0_4_ = local_1100;
      auVar43._8_4_ = fStack_10f8;
      auVar43._12_4_ = fStack_10f4;
      auVar43._16_4_ = fStack_10f0;
      auVar43._20_4_ = fStack_10ec;
      auVar43._24_4_ = fStack_10e8;
      auVar43._28_4_ = uStack_10e4;
      auVar52 = vblendvps_avx(auVar47,auVar43,local_1340);
      auVar29 = vshufps_avx(auVar52,auVar52,0xb1);
      auVar52 = vminps_avx(auVar52,auVar29);
      auVar29 = vshufpd_avx(auVar52,auVar52,5);
      auVar52 = vminps_avx(auVar52,auVar29);
      auVar7 = vminps_avx(auVar52._0_16_,auVar52._16_16_);
      auVar44 = vinsertps_avx(auVar44,auVar7,0x28);
      auVar52 = vblendvps_avx(auVar60,auVar12,local_1340);
      auVar29 = vshufps_avx(auVar52,auVar52,0xb1);
      auVar52 = vmaxps_avx(auVar52,auVar29);
      auVar29 = vshufpd_avx(auVar52,auVar52,5);
      auVar52 = vmaxps_avx(auVar52,auVar29);
      auVar7 = vmaxps_avx(auVar52._0_16_,auVar52._16_16_);
      auVar52 = vblendvps_avx(auVar60,auVar11,local_1340);
      auVar29 = vshufps_avx(auVar52,auVar52,0xb1);
      auVar52 = vmaxps_avx(auVar52,auVar29);
      auVar29 = vshufpd_avx(auVar52,auVar52,5);
      auVar52 = vmaxps_avx(auVar52,auVar29);
      auVar3 = vmaxps_avx(auVar52._0_16_,auVar52._16_16_);
      auVar52 = vblendvps_avx(auVar60,auVar43,local_1340);
      auVar3 = vunpcklps_avx(auVar7,auVar3);
      auVar29 = vshufps_avx(auVar52,auVar52,0xb1);
      auVar52 = vmaxps_avx(auVar52,auVar29);
      auVar29 = vshufpd_avx(auVar52,auVar52,5);
      auVar52 = vmaxps_avx(auVar52,auVar29);
      auVar7 = vmaxps_avx(auVar52._0_16_,auVar52._16_16_);
      auVar3 = vinsertps_avx(auVar3,auVar7,0x28);
      auVar7 = vblendvps_avx(auVar3,auVar44,auVar54);
      auVar44 = vblendvps_avx(auVar44,auVar3,auVar54);
      local_1320 = vblendvps_avx(auVar60,local_1140,local_1340);
      auVar52 = vshufps_avx(local_1320,local_1320,0xb1);
      auVar52 = vmaxps_avx(local_1320,auVar52);
      auVar29 = vshufpd_avx(auVar52,auVar52,5);
      auVar29 = vmaxps_avx(auVar52,auVar29);
      auVar52 = vblendvps_avx(auVar47,local_1120,local_1340);
      auVar43 = vshufps_avx(auVar52,auVar52,0xb1);
      auVar52 = vminps_avx(auVar52,auVar43);
      auVar43 = vshufpd_avx(auVar52,auVar52,5);
      auVar52 = vminps_avx(auVar52,auVar43);
      auVar4 = vminps_avx(auVar52._0_16_,auVar52._16_16_);
      auVar53 = ZEXT3264(auVar53._0_32_);
      auVar3 = vmaxps_avx(auVar29._0_16_,auVar29._16_16_);
      auVar54 = vblendvps_avx(auVar39,auVar2,auVar54);
      auVar39._0_4_ = auVar44._0_4_ * local_11f0;
      auVar39._4_4_ = auVar44._4_4_ * auVar6._4_4_;
      auVar39._8_4_ = auVar44._8_4_ * auVar6._8_4_;
      auVar39._12_4_ = auVar44._12_4_ * auVar6._12_4_;
      local_1250 = auVar54._0_4_;
      auVar44._0_4_ = auVar7._0_4_ * local_1250;
      auVar44._4_4_ = auVar7._4_4_ * auVar54._4_4_;
      auVar44._8_4_ = auVar7._8_4_ * auVar54._8_4_;
      auVar44._12_4_ = auVar7._12_4_ * auVar54._12_4_;
      uVar26 = (ulong)(local_11f0 < 0.0) * 0x10;
      local_fa0[0] = *(ulong *)&pAVar1[1].bounds.bounds0.lower.field_0;
      local_fa0[1] = uVar16;
      local_1200 = (uint)auVar39._0_4_ ^ local_12d0;
      uStack_11fc = (uint)auVar39._0_4_ ^ uStack_12cc;
      uStack_11f8 = (uint)auVar39._0_4_ ^ uStack_12c8;
      uStack_11f4 = (uint)auVar39._0_4_ ^ uStack_12c4;
      local_1210 = vshufps_avx(auVar6,auVar6,0x55);
      auVar7 = vshufps_avx(auVar39,auVar39,0x55);
      local_1220 = auVar7._0_4_ ^ local_12d0;
      uStack_121c = auVar7._4_4_ ^ uStack_12cc;
      uStack_1218 = auVar7._8_4_ ^ uStack_12c8;
      uStack_1214 = auVar7._12_4_ ^ uStack_12c4;
      local_1230 = vshufps_avx(auVar6,auVar6,0xaa);
      auVar6 = vshufps_avx(auVar39,auVar39,0xaa);
      local_1240 = auVar6._0_4_ ^ local_12d0;
      uStack_123c = auVar6._4_4_ ^ uStack_12cc;
      uStack_1238 = auVar6._8_4_ ^ uStack_12c8;
      uStack_1234 = auVar6._12_4_ ^ uStack_12c4;
      local_1260 = (uint)auVar44._0_4_ ^ local_12d0;
      uStack_125c = (uint)auVar44._0_4_ ^ uStack_12cc;
      uStack_1258 = (uint)auVar44._0_4_ ^ uStack_12c8;
      uStack_1254 = (uint)auVar44._0_4_ ^ uStack_12c4;
      local_1270 = vshufps_avx(auVar54,auVar54,0x55);
      auVar6 = vshufps_avx(auVar44,auVar44,0x55);
      local_1280._0_4_ = auVar6._0_4_ ^ local_12d0;
      local_1280._4_4_ = auVar6._4_4_ ^ uStack_12cc;
      local_1280._8_4_ = auVar6._8_4_ ^ uStack_12c8;
      local_1280._12_4_ = auVar6._12_4_ ^ uStack_12c4;
      local_1290 = vshufps_avx(auVar54,auVar54,0xaa);
      auVar6 = vshufps_avx(auVar44,auVar44,0xaa);
      local_12a0 = auVar6._0_4_ ^ local_12d0;
      uStack_129c = auVar6._4_4_ ^ uStack_12cc;
      uStack_1298 = auVar6._8_4_ ^ uStack_12c8;
      uStack_1294 = auVar6._12_4_ ^ uStack_12c4;
      local_12b0 = auVar4._0_4_;
      local_12c0 = auVar3._0_4_;
      puVar20 = local_fa0 + 2;
      auVar52._4_4_ = uStack_115c;
      auVar52._0_4_ = local_1160;
      auVar52._8_4_ = uStack_1158;
      auVar52._12_4_ = uStack_1154;
      auVar52._16_4_ = uStack_1150;
      auVar52._20_4_ = uStack_114c;
      auVar52._24_4_ = uStack_1148;
      auVar52._28_4_ = uStack_1144;
      local_1300 = vblendvps_avx(auVar52,local_1120,local_1340);
      auVar32 = ZEXT3264(local_1300);
      auVar61 = ZEXT3264(CONCAT428(uStack_11a4,
                                   CONCAT424(fStack_11a8,
                                             CONCAT420(fStack_11ac,
                                                       CONCAT416(fStack_11b0,
                                                                 CONCAT412(fStack_11b4,
                                                                           CONCAT48(fStack_11b8,
                                                                                    CONCAT44(
                                                  fStack_11bc,local_11c0))))))));
      auVar51 = ZEXT3264(CONCAT428(uStack_11c4,
                                   CONCAT424(fStack_11c8,
                                             CONCAT420(fStack_11cc,
                                                       CONCAT416(fStack_11d0,
                                                                 CONCAT412(fStack_11d4,
                                                                           CONCAT48(fStack_11d8,
                                                                                    CONCAT44(
                                                  fStack_11dc,local_11e0))))))));
      uStack_12bc = local_12c0;
      uStack_12b8 = local_12c0;
      uStack_12b4 = local_12c0;
      uStack_12ac = local_12b0;
      uStack_12a8 = local_12b0;
      uStack_12a4 = local_12b0;
      fStack_124c = local_1250;
      fStack_1248 = local_1250;
      fStack_1244 = local_1250;
      fStack_11ec = local_11f0;
      fStack_11e8 = local_11f0;
      fStack_11e4 = local_11f0;
      do {
        auVar52 = auVar32._0_32_;
        local_1040 = auVar53._0_32_;
        if (puVar20 == local_fa0) break;
        puVar27 = puVar20 + -2;
        uVar15 = vmovmskps_avx(local_1040);
        local_1358 = (Geometry *)(~CONCAT44((int)(uVar16 >> 0x20),uVar15) & puVar20[-1]);
        if (local_1358 != (Geometry *)0x0) {
          uVar16 = *puVar27;
          auVar59 = ZEXT3264(local_1320);
LAB_0060e7b6:
          if ((uVar16 & 8) == 0) goto code_r0x0060e7c0;
          if (local_1358 != (Geometry *)0x0) {
            uVar21 = (ulong)((uint)uVar16 & 0xf);
            auVar52 = local_1040;
            auVar29 = local_1320;
            if (uVar21 != 8) {
              local_1020._0_8_ = auVar53._0_8_ ^ 0xffffffffffffffff;
              local_1020._8_4_ = auVar53._8_4_ ^ 0xffffffff;
              local_1020._12_4_ = auVar53._12_4_ ^ 0xffffffff;
              local_1020._16_4_ = auVar53._16_4_ ^ 0xffffffff;
              local_1020._20_4_ = auVar53._20_4_ ^ 0xffffffff;
              local_1020._24_4_ = auVar53._24_4_ ^ 0xffffffff;
              local_1020._28_4_ = auVar53._28_4_ ^ 0xffffffff;
              pGVar24 = (Geometry *)0x1;
              do {
                local_1388.geomID =
                     *(uint *)(((uVar16 & 0xfffffffffffffff0) - 8) + (long)pGVar24 * 8);
                local_1358 = (context->scene->geometries).items[local_1388.geomID].ptr;
                uVar14 = local_1358->mask;
                auVar31._4_4_ = uVar14;
                auVar31._0_4_ = uVar14;
                auVar31._8_4_ = uVar14;
                auVar31._12_4_ = uVar14;
                auVar31._16_4_ = uVar14;
                auVar31._20_4_ = uVar14;
                auVar31._24_4_ = uVar14;
                auVar31._28_4_ = uVar14;
                auVar52 = vpand_avx2(auVar31,*(undefined1 (*) [32])(ray + 0x120));
                auVar29 = vpcmpeqd_avx2(auVar55._0_32_,auVar52);
                auVar52 = local_1020 & ~auVar29;
                auVar36._8_8_ = uStack_ff8;
                auVar36._0_8_ = local_1000;
                auVar36._16_8_ = uStack_ff0;
                auVar36._24_8_ = uStack_fe8;
                auVar43 = local_1020;
                if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar52 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar52 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar52 >> 0x7f,0) != '\0') ||
                      (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar52 >> 0xbf,0) != '\0') ||
                    (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar52[0x1f] < '\0') {
                  local_fc0 = vandnps_avx(auVar29,local_1020);
                  local_1388.primID =
                       *(uint *)(((uVar16 & 0xfffffffffffffff0) - 4) + (long)pGVar24 * 8);
                  local_1388.valid = (int *)local_fc0;
                  local_1388.geometryUserPtr = local_1358->userPtr;
                  local_1388.context = context->user;
                  local_1388.N = 8;
                  local_1350 = 0;
                  local_1348 = context->args;
                  p_Var17 = local_1348->intersect;
                  if (p_Var17 == (RTCIntersectFunctionN)0x0) {
                    p_Var17 = (RTCIntersectFunctionN)
                              local_1358[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i;
                  }
                  local_1388.rayhit = (RTCRayHitN *)ray;
                  local_1358 = (Geometry *)(*p_Var17)(&local_1388);
                  auVar55 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar36 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),
                                       ZEXT1632(ZEXT816(0) << 0x40),1);
                  auVar56 = ZEXT3264(local_1060);
                  auVar57 = ZEXT3264(local_1080);
                  auVar58 = ZEXT3264(local_10a0);
                  auVar53 = ZEXT3264(local_1040);
                  auVar61 = ZEXT3264(CONCAT428(uStack_11a4,
                                               CONCAT424(fStack_11a8,
                                                         CONCAT420(fStack_11ac,
                                                                   CONCAT416(fStack_11b0,
                                                                             CONCAT412(fStack_11b4,
                                                                                       CONCAT48(
                                                  fStack_11b8,CONCAT44(fStack_11bc,local_11c0)))))))
                                    );
                  auVar51 = ZEXT3264(CONCAT428(uStack_11c4,
                                               CONCAT424(fStack_11c8,
                                                         CONCAT420(fStack_11cc,
                                                                   CONCAT416(fStack_11d0,
                                                                             CONCAT412(fStack_11d4,
                                                                                       CONCAT48(
                                                  fStack_11d8,CONCAT44(fStack_11dc,local_11e0)))))))
                                    );
                  auVar59 = ZEXT3264(local_1320);
                  auVar43 = local_1020;
                }
                auVar29 = auVar59._0_32_;
                auVar52 = auVar53._0_32_;
                local_1020 = vandnps_avx(auVar36,auVar43);
                auVar43 = auVar43 & ~auVar36;
              } while (((((((((auVar43 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar43 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar43 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar43 >> 0x7f,0) != '\0') ||
                          (auVar43 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar43 >> 0xbf,0) != '\0') ||
                        (auVar43 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar43[0x1f] < '\0') &&
                      (local_1358 = (Geometry *)
                                    ((long)&(pGVar24->super_RefCount)._vptr_RefCount + 1),
                      bVar28 = pGVar24 < (Geometry *)(uVar21 - 8), pGVar24 = local_1358, bVar28));
              local_1040._0_8_ = local_1020._0_8_ ^ 0xffffffffffffffff;
              local_1040._8_4_ = local_1020._8_4_ ^ 0xffffffff;
              local_1040._12_4_ = local_1020._12_4_ ^ 0xffffffff;
              local_1040._16_4_ = local_1020._16_4_ ^ 0xffffffff;
              local_1040._20_4_ = local_1020._20_4_ ^ 0xffffffff;
              local_1040._24_4_ = local_1020._24_4_ ^ 0xffffffff;
              local_1040._28_4_ = local_1020._28_4_ ^ 0xffffffff;
            }
            auVar43 = vorps_avx(auVar52,local_1040);
            auVar53 = ZEXT3264(auVar43);
            auVar52 = vandnps_avx(auVar43,local_1340);
            auVar32 = ZEXT3264(auVar52);
            auVar33 = local_1340 & ~auVar43;
            puVar20 = puVar27;
            local_1340 = auVar52;
            if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar33 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar33 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar33 >> 0x7f,0) == '\0') &&
                  (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar33 >> 0xbf,0) == '\0') &&
                (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar33[0x1f]) {
              uVar16 = CONCAT71((int7)((ulong)local_1358 >> 8),1);
            }
            else {
              auVar37._8_4_ = 0xff800000;
              auVar37._0_8_ = 0xff800000ff800000;
              auVar37._12_4_ = 0xff800000;
              auVar37._16_4_ = 0xff800000;
              auVar37._20_4_ = 0xff800000;
              auVar37._24_4_ = 0xff800000;
              auVar37._28_4_ = 0xff800000;
              local_1320 = vblendvps_avx(auVar29,auVar37,auVar43);
              uVar16 = 0;
            }
            goto LAB_0060eb84;
          }
        }
LAB_0060eb82:
        uVar16 = 0;
        puVar20 = puVar27;
LAB_0060eb84:
        auVar52 = auVar32._0_32_;
      } while ((char)uVar16 == '\0');
    } while (uVar19 != 0);
    auVar52 = vpcmpeqd_avx2(auVar52,auVar52);
    auVar52 = vpcmpeqd_avx2(auVar52,(undefined1  [32])local_1180);
    auVar52 = vpand_avx2(auVar53._0_32_,auVar52);
    auVar38._8_4_ = 0xff800000;
    auVar38._0_8_ = 0xff800000ff800000;
    auVar38._12_4_ = 0xff800000;
    auVar38._16_4_ = 0xff800000;
    auVar38._20_4_ = 0xff800000;
    auVar38._24_4_ = 0xff800000;
    auVar38._28_4_ = 0xff800000;
    auVar52 = vmaskmovps_avx(auVar52,auVar38);
    *(undefined1 (*) [32])(ray + 0x100) = auVar52;
  }
  return;
code_r0x0060e7c0:
  auVar6._4_4_ = uStack_11fc;
  auVar6._0_4_ = local_1200;
  auVar6._8_4_ = uStack_11f8;
  auVar6._12_4_ = uStack_11f4;
  auVar10._4_4_ = fStack_11ec;
  auVar10._0_4_ = local_11f0;
  auVar10._8_4_ = fStack_11e8;
  auVar10._12_4_ = fStack_11e4;
  auVar6 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar16 + 0x20 + uVar26),auVar6,auVar10);
  auVar9._4_4_ = uStack_121c;
  auVar9._0_4_ = local_1220;
  auVar9._8_4_ = uStack_1218;
  auVar9._12_4_ = uStack_1214;
  auVar7 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar16 + 0x20 + uVar25),auVar9,local_1210);
  auVar6 = vpmaxsd_avx(auVar6,auVar7);
  auVar8._4_4_ = uStack_123c;
  auVar8._0_4_ = local_1240;
  auVar8._8_4_ = uStack_1238;
  auVar8._12_4_ = uStack_1234;
  auVar7 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar16 + 0x20 + uVar18),auVar8,local_1230);
  auVar2._4_4_ = uStack_12ac;
  auVar2._0_4_ = local_12b0;
  auVar2._8_4_ = uStack_12a8;
  auVar2._12_4_ = uStack_12a4;
  auVar7 = vpmaxsd_avx(auVar7,auVar2);
  auVar6 = vpmaxsd_avx(auVar6,auVar7);
  auVar7._4_4_ = uStack_125c;
  auVar7._0_4_ = local_1260;
  auVar7._8_4_ = uStack_1258;
  auVar7._12_4_ = uStack_1254;
  auVar4._4_4_ = fStack_124c;
  auVar4._0_4_ = local_1250;
  auVar4._8_4_ = fStack_1248;
  auVar4._12_4_ = fStack_1244;
  auVar7 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar16 + 0x20 + (uVar26 ^ 0x10)),auVar7,auVar4);
  auVar44 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar16 + 0x20 + (uVar25 ^ 0x10)),local_1280,
                            local_1270);
  auVar7 = vpminsd_avx(auVar7,auVar44);
  auVar3._4_4_ = uStack_129c;
  auVar3._0_4_ = local_12a0;
  auVar3._8_4_ = uStack_1298;
  auVar3._12_4_ = uStack_1294;
  auVar44 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar16 + 0x20 + (uVar18 ^ 0x10)),auVar3,
                            local_1290);
  auVar54._4_4_ = uStack_12bc;
  auVar54._0_4_ = local_12c0;
  auVar54._8_4_ = uStack_12b8;
  auVar54._12_4_ = uStack_12b4;
  auVar44 = vpminsd_avx(auVar44,auVar54);
  auVar7 = vpminsd_avx(auVar7,auVar44);
  auVar6 = vcmpps_avx(auVar6,auVar7,2);
  auVar32 = ZEXT1664(auVar6);
  uVar14 = vmovmskps_avx(auVar6);
  if (uVar14 == 0) {
    bVar28 = false;
  }
  else {
    uVar22 = (ulong)(uVar14 & 0xff);
    local_1358 = (Geometry *)0x0;
    uVar21 = 8;
    do {
      lVar5 = 0;
      for (uVar23 = uVar22; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
        lVar5 = lVar5 + 1;
      }
      uVar15 = *(undefined4 *)(uVar16 + 0x20 + lVar5 * 4);
      auVar30._4_4_ = uVar15;
      auVar30._0_4_ = uVar15;
      auVar30._8_4_ = uVar15;
      auVar30._12_4_ = uVar15;
      auVar30._16_4_ = uVar15;
      auVar30._20_4_ = uVar15;
      auVar30._24_4_ = uVar15;
      auVar30._28_4_ = uVar15;
      uVar15 = *(undefined4 *)(uVar16 + 0x40 + lVar5 * 4);
      auVar35._4_4_ = uVar15;
      auVar35._0_4_ = uVar15;
      auVar35._8_4_ = uVar15;
      auVar35._12_4_ = uVar15;
      auVar35._16_4_ = uVar15;
      auVar35._20_4_ = uVar15;
      auVar35._24_4_ = uVar15;
      auVar35._28_4_ = uVar15;
      auVar6 = vfmadd213ps_fma(auVar30,auVar56._0_32_,auVar61._0_32_);
      auVar7 = vfmadd213ps_fma(auVar35,auVar57._0_32_,auVar51._0_32_);
      uVar15 = *(undefined4 *)(uVar16 + 0x60 + lVar5 * 4);
      auVar42._4_4_ = uVar15;
      auVar42._0_4_ = uVar15;
      auVar42._8_4_ = uVar15;
      auVar42._12_4_ = uVar15;
      auVar42._16_4_ = uVar15;
      auVar42._20_4_ = uVar15;
      auVar42._24_4_ = uVar15;
      auVar42._28_4_ = uVar15;
      auVar13._4_4_ = fStack_fdc;
      auVar13._0_4_ = local_fe0;
      auVar13._8_4_ = fStack_fd8;
      auVar13._12_4_ = fStack_fd4;
      auVar13._16_4_ = fStack_fd0;
      auVar13._20_4_ = fStack_fcc;
      auVar13._24_4_ = fStack_fc8;
      auVar13._28_4_ = uStack_fc4;
      auVar44 = vfmadd213ps_fma(auVar42,auVar58._0_32_,auVar13);
      uVar15 = *(undefined4 *)(uVar16 + 0x30 + lVar5 * 4);
      auVar48._4_4_ = uVar15;
      auVar48._0_4_ = uVar15;
      auVar48._8_4_ = uVar15;
      auVar48._12_4_ = uVar15;
      auVar48._16_4_ = uVar15;
      auVar48._20_4_ = uVar15;
      auVar48._24_4_ = uVar15;
      auVar48._28_4_ = uVar15;
      auVar54 = vfmadd213ps_fma(auVar48,auVar56._0_32_,auVar61._0_32_);
      uVar15 = *(undefined4 *)(uVar16 + 0x50 + lVar5 * 4);
      auVar49._4_4_ = uVar15;
      auVar49._0_4_ = uVar15;
      auVar49._8_4_ = uVar15;
      auVar49._12_4_ = uVar15;
      auVar49._16_4_ = uVar15;
      auVar49._20_4_ = uVar15;
      auVar49._24_4_ = uVar15;
      auVar49._28_4_ = uVar15;
      uVar15 = *(undefined4 *)(uVar16 + 0x70 + lVar5 * 4);
      auVar50._4_4_ = uVar15;
      auVar50._0_4_ = uVar15;
      auVar50._8_4_ = uVar15;
      auVar50._12_4_ = uVar15;
      auVar50._16_4_ = uVar15;
      auVar50._20_4_ = uVar15;
      auVar50._24_4_ = uVar15;
      auVar50._28_4_ = uVar15;
      auVar39 = vfmadd213ps_fma(auVar49,auVar57._0_32_,auVar51._0_32_);
      auVar2 = vfmadd213ps_fma(auVar50,auVar58._0_32_,auVar13);
      auVar52 = vpminsd_avx2(ZEXT1632(auVar6),ZEXT1632(auVar54));
      auVar29 = vpminsd_avx2(ZEXT1632(auVar7),ZEXT1632(auVar39));
      auVar52 = vpmaxsd_avx2(auVar52,auVar29);
      auVar29 = vpminsd_avx2(ZEXT1632(auVar44),ZEXT1632(auVar2));
      auVar29 = vpmaxsd_avx2(auVar29,local_1300);
      auVar52 = vpmaxsd_avx2(auVar52,auVar29);
      auVar29 = vpmaxsd_avx2(ZEXT1632(auVar6),ZEXT1632(auVar54));
      auVar43 = vpmaxsd_avx2(ZEXT1632(auVar7),ZEXT1632(auVar39));
      auVar43 = vpminsd_avx2(auVar29,auVar43);
      auVar29 = vpmaxsd_avx2(ZEXT1632(auVar44),ZEXT1632(auVar2));
      auVar29 = vpminsd_avx2(auVar29,local_1320);
      auVar29 = vpminsd_avx2(auVar43,auVar29);
      auVar52 = vcmpps_avx(auVar52,auVar29,2);
      auVar32 = ZEXT3264(auVar52);
      uVar23 = uVar21;
      if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar52 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar52 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar52 >> 0x7f,0) != '\0') ||
            (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar52 >> 0xbf,0) != '\0') ||
          (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar52[0x1f] < '\0') {
        uVar23 = *(ulong *)(uVar16 + lVar5 * 8);
        if (uVar21 != 8) {
          *puVar27 = uVar21;
          puVar27[1] = (ulong)local_1358;
          puVar27 = puVar27 + 2;
        }
        uVar14 = vmovmskps_avx(auVar52);
        local_1358 = (Geometry *)(ulong)uVar14;
      }
      uVar22 = uVar22 - 1 & uVar22;
      uVar21 = uVar23;
    } while (uVar22 != 0);
    bVar28 = uVar23 != 8;
    uVar16 = uVar23;
  }
  if (!bVar28) goto LAB_0060eb82;
  goto LAB_0060e7b6;
}

Assistant:

static __forceinline vboolf8 operator ==(const vint8& a, const vint8& b) { return _mm256_castsi256_ps(_mm256_cmpeq_epi32(a, b)); }